

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

bool embree::avx::SphereMiIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  float fVar25;
  float fVar34;
  float fVar35;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar36;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2b0 [16];
  RTCFilterFunctionNArguments local_2a0;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar45 [64];
  undefined1 auVar57 [64];
  
  pSVar5 = context->scene;
  pGVar6 = (pSVar5->geometries).items[sphere->sharedGeomID].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar26 = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[0] * _Var8);
  auVar21 = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[1] * _Var8);
  auVar46 = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[2] * _Var8);
  auVar31 = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[3] * _Var8);
  auVar37 = vunpcklps_avx(auVar26,auVar46);
  auVar26 = vunpckhps_avx(auVar26,auVar46);
  auVar46 = vunpcklps_avx(auVar21,auVar31);
  auVar21 = vunpckhps_avx(auVar21,auVar31);
  auVar31 = vunpcklps_avx(auVar37,auVar46);
  auVar46 = vunpckhps_avx(auVar37,auVar46);
  auVar16 = vunpcklps_avx(auVar26,auVar21);
  auVar28 = vunpckhps_avx(auVar26,auVar21);
  auVar26 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar21 = vpcmpgtd_avx(auVar26,_DAT_01f4ad30);
  local_190 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar31 = vsubps_avx(auVar31,auVar42);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37 = vsubps_avx(auVar46,auVar37);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar16 = vsubps_avx(auVar16,auVar26);
  fVar2 = *(float *)(ray + k * 4 + 0x80);
  auVar53 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  auVar54 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar55 = ZEXT1664(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))));
  auVar26 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar46 = vshufps_avx(auVar26,auVar26,0);
  auVar26 = vrcpps_avx(auVar46);
  fVar25 = auVar26._0_4_;
  auVar27._0_4_ = fVar25 * auVar46._0_4_;
  fVar34 = auVar26._4_4_;
  auVar27._4_4_ = fVar34 * auVar46._4_4_;
  fVar35 = auVar26._8_4_;
  auVar27._8_4_ = fVar35 * auVar46._8_4_;
  fVar36 = auVar26._12_4_;
  auVar27._12_4_ = fVar36 * auVar46._12_4_;
  auVar46._8_4_ = 0x3f800000;
  auVar46._0_8_ = 0x3f8000003f800000;
  auVar46._12_4_ = 0x3f800000;
  auVar26 = vsubps_avx(auVar46,auVar27);
  fVar25 = fVar25 + fVar25 * auVar26._0_4_;
  fVar34 = fVar34 + fVar34 * auVar26._4_4_;
  fVar35 = fVar35 + fVar35 * auVar26._8_4_;
  fVar36 = fVar36 + fVar36 * auVar26._12_4_;
  auVar38._0_4_ = (fVar2 * auVar31._0_4_ + fVar3 * auVar37._0_4_ + fVar4 * auVar16._0_4_) * fVar25;
  auVar38._4_4_ = (fVar2 * auVar31._4_4_ + fVar3 * auVar37._4_4_ + fVar4 * auVar16._4_4_) * fVar34;
  auVar38._8_4_ = (fVar2 * auVar31._8_4_ + fVar3 * auVar37._8_4_ + fVar4 * auVar16._8_4_) * fVar35;
  auVar38._12_4_ =
       (fVar2 * auVar31._12_4_ + fVar3 * auVar37._12_4_ + fVar4 * auVar16._12_4_) * fVar36;
  auVar47._0_4_ = fVar2 * auVar38._0_4_;
  auVar47._4_4_ = fVar2 * auVar38._4_4_;
  auVar47._8_4_ = fVar2 * auVar38._8_4_;
  auVar47._12_4_ = fVar2 * auVar38._12_4_;
  auVar49._0_4_ = fVar3 * auVar38._0_4_;
  auVar49._4_4_ = fVar3 * auVar38._4_4_;
  auVar49._8_4_ = fVar3 * auVar38._8_4_;
  auVar49._12_4_ = fVar3 * auVar38._12_4_;
  auVar51._0_4_ = fVar4 * auVar38._0_4_;
  auVar51._4_4_ = fVar4 * auVar38._4_4_;
  auVar51._8_4_ = fVar4 * auVar38._8_4_;
  auVar51._12_4_ = fVar4 * auVar38._12_4_;
  auVar46 = vsubps_avx(auVar31,auVar47);
  auVar48 = ZEXT1664(auVar46);
  auVar31 = vsubps_avx(auVar37,auVar49);
  auVar50 = ZEXT1664(auVar31);
  auVar37 = vsubps_avx(auVar16,auVar51);
  auVar52 = ZEXT1664(auVar37);
  auVar40._0_4_ =
       auVar46._0_4_ * auVar46._0_4_ + auVar31._0_4_ * auVar31._0_4_ + auVar37._0_4_ * auVar37._0_4_
  ;
  auVar40._4_4_ =
       auVar46._4_4_ * auVar46._4_4_ + auVar31._4_4_ * auVar31._4_4_ + auVar37._4_4_ * auVar37._4_4_
  ;
  auVar40._8_4_ =
       auVar46._8_4_ * auVar46._8_4_ + auVar31._8_4_ * auVar31._8_4_ + auVar37._8_4_ * auVar37._8_4_
  ;
  auVar40._12_4_ =
       auVar46._12_4_ * auVar46._12_4_ +
       auVar31._12_4_ * auVar31._12_4_ + auVar37._12_4_ * auVar37._12_4_;
  auVar20._0_4_ = auVar28._0_4_ * auVar28._0_4_;
  auVar20._4_4_ = auVar28._4_4_ * auVar28._4_4_;
  auVar20._8_4_ = auVar28._8_4_ * auVar28._8_4_;
  auVar20._12_4_ = auVar28._12_4_ * auVar28._12_4_;
  auVar26 = vcmpps_avx(auVar40,auVar20,2);
  auVar16 = auVar21 & auVar26;
  if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar16[0xf] < '\0') {
    auVar26 = vandps_avx(auVar26,auVar21);
    auVar21 = vsubps_avx(auVar20,auVar40);
    auVar16._0_4_ = fVar25 * auVar21._0_4_;
    auVar16._4_4_ = fVar34 * auVar21._4_4_;
    auVar16._8_4_ = fVar35 * auVar21._8_4_;
    auVar16._12_4_ = fVar36 * auVar21._12_4_;
    auVar20 = vsqrtps_avx(auVar16);
    auVar58 = ZEXT1664(auVar20);
    auVar27 = vsubps_avx(auVar38,auVar20);
    auVar56._0_4_ = auVar20._0_4_ + auVar38._0_4_;
    auVar56._4_4_ = auVar20._4_4_ + auVar38._4_4_;
    auVar56._8_4_ = auVar20._8_4_ + auVar38._8_4_;
    auVar56._12_4_ = auVar20._12_4_ + auVar38._12_4_;
    auVar57 = ZEXT1664(auVar56);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar28._4_4_ = uVar1;
    auVar28._0_4_ = uVar1;
    auVar28._8_4_ = uVar1;
    auVar28._12_4_ = uVar1;
    auVar21 = vcmpps_avx(auVar28,auVar27,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar44._4_4_ = uVar1;
    auVar44._0_4_ = uVar1;
    auVar44._8_4_ = uVar1;
    auVar44._12_4_ = uVar1;
    auVar45 = ZEXT1664(auVar44);
    auVar16 = vcmpps_avx(auVar27,auVar44,2);
    auVar21 = vandps_avx(auVar16,auVar21);
    auVar59 = ZEXT1664(auVar21);
    auVar21 = vandps_avx(auVar21,auVar26);
    auVar16 = vcmpps_avx(auVar28,auVar56,2);
    auVar28 = vcmpps_avx(auVar56,auVar44,2);
    auVar16 = vandps_avx(auVar16,auVar28);
    auVar26 = vandps_avx(auVar16,auVar26);
    auVar41 = ZEXT1664(auVar26);
    auVar26 = vorps_avx(auVar21,auVar26);
    uVar12 = vmovmskps_avx(auVar26);
    if (uVar12 != 0) {
      auVar29._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
      auVar29._8_4_ = -auVar20._8_4_;
      auVar29._12_4_ = -auVar20._12_4_;
      local_1e0 = vblendvps_avx(auVar56,auVar27,auVar21);
      auVar26 = vblendvps_avx(auVar20,auVar29,auVar21);
      fVar25 = auVar26._0_4_;
      auVar30._0_4_ = fVar2 * fVar25;
      fVar34 = auVar26._4_4_;
      auVar30._4_4_ = fVar2 * fVar34;
      fVar35 = auVar26._8_4_;
      auVar30._8_4_ = fVar2 * fVar35;
      fVar36 = auVar26._12_4_;
      auVar30._12_4_ = fVar2 * fVar36;
      auVar39._0_4_ = fVar3 * fVar25;
      auVar39._4_4_ = fVar3 * fVar34;
      auVar39._8_4_ = fVar3 * fVar35;
      auVar39._12_4_ = fVar3 * fVar36;
      auVar21._0_4_ = fVar4 * fVar25;
      auVar21._4_4_ = fVar4 * fVar34;
      auVar21._8_4_ = fVar4 * fVar35;
      auVar21._12_4_ = fVar4 * fVar36;
      local_1d0 = vsubps_avx(auVar30,auVar46);
      local_1c0 = vsubps_avx(auVar39,auVar31);
      local_1b0 = vsubps_avx(auVar21,auVar37);
      uVar14 = (ulong)(uVar12 & 0xff);
      uVar12 = 1 << ((byte)k & 0x1f);
      auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      do {
        auVar21 = auVar52._0_16_;
        auVar26 = auVar48._0_16_;
        local_2a0.valid = (int *)local_2e0;
        auVar33 = auVar50._0_32_;
        auVar37 = auVar55._0_16_;
        auVar31 = auVar54._0_16_;
        auVar28 = auVar58._0_16_;
        auVar46 = auVar53._0_16_;
        auVar20 = auVar59._0_16_;
        auVar16 = auVar57._0_16_;
        uVar10 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar13 = *(uint *)(local_190 + uVar10 * 4);
        pGVar6 = (pSVar5->geometries).items[uVar13].ptr;
        local_2a0.ray = (RTCRayN *)ray;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar15 = true, auVar27 = auVar41._0_16_,
             pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00762874;
          local_1a0 = auVar41._0_16_;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1e0 + uVar10 * 4);
          local_2a0.context = context->user;
          local_e0 = (sphere->primIDs).field_0.i[uVar10];
          local_180 = *(undefined4 *)(local_1d0 + uVar10 * 4);
          local_160 = *(undefined4 *)(local_1c0 + uVar10 * 4);
          local_b0 = vpshufd_avx(ZEXT416(uVar13),0);
          local_140._4_4_ = *(undefined4 *)(local_1b0 + uVar10 * 4);
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          uStack_15c = local_160;
          uStack_158 = local_160;
          uStack_154 = local_160;
          uStack_150 = local_160;
          uStack_14c = local_160;
          uStack_148 = local_160;
          uStack_144 = local_160;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          local_100 = ZEXT432(0) << 0x20;
          local_120 = ZEXT432(0) << 0x20;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          vcmpps_avx(ZEXT1632(local_b0),ZEXT1632(local_b0),0xf);
          uStack_9c = (local_2a0.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_2a0.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar12 & 0xf) << 4));
          local_2d0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar12 >> 4) * 0x10);
          local_2a0.geometryUserPtr = pGVar6->userPtr;
          local_2a0.hit = (RTCHitN *)&local_180;
          local_2a0.N = 8;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2b0 = auVar45._0_16_;
            local_230 = auVar50._0_16_;
            local_270 = auVar20;
            local_260 = auVar28;
            local_250 = auVar16;
            local_240 = auVar21;
            local_220 = auVar26;
            local_210 = auVar37;
            local_200 = auVar31;
            local_1f0 = auVar46;
            (*pGVar6->occlusionFilterN)(&local_2a0);
            auVar59 = ZEXT1664(local_270);
            auVar58 = ZEXT1664(local_260);
            auVar57 = ZEXT1664(local_250);
            auVar52 = ZEXT1664(local_240);
            auVar50 = ZEXT1664(local_230);
            auVar48 = ZEXT1664(local_220);
            auVar55 = ZEXT1664(local_210);
            auVar54 = ZEXT1664(local_200);
            auVar53 = ZEXT1664(local_1f0);
            auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar45 = ZEXT1664(local_2b0);
          }
          auVar26 = vpcmpeqd_avx(local_2e0,ZEXT816(0) << 0x40);
          auVar21 = vpcmpeqd_avx(local_2d0,ZEXT816(0) << 0x40);
          auVar32._16_16_ = auVar21;
          auVar32._0_16_ = auVar26;
          auVar33 = vcmpps_avx(ZEXT1632(auVar21),ZEXT1632(auVar21),0xf);
          auVar32 = auVar33 & ~auVar32;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar32[0x1f]) {
            auVar18._0_4_ = auVar26._0_4_ ^ auVar33._0_4_;
            auVar18._4_4_ = auVar26._4_4_ ^ auVar33._4_4_;
            auVar18._8_4_ = auVar26._8_4_ ^ auVar33._8_4_;
            auVar18._12_4_ = auVar26._12_4_ ^ auVar33._12_4_;
            auVar18._16_4_ = auVar21._0_4_ ^ auVar33._16_4_;
            auVar18._20_4_ = auVar21._4_4_ ^ auVar33._20_4_;
            auVar18._24_4_ = auVar21._8_4_ ^ auVar33._24_4_;
            auVar18._28_4_ = auVar21._12_4_ ^ auVar33._28_4_;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              local_2b0 = auVar45._0_16_;
              local_1f0 = auVar53._0_16_;
              local_200 = auVar54._0_16_;
              local_210 = auVar55._0_16_;
              local_220 = auVar48._0_16_;
              local_230 = auVar50._0_16_;
              local_240 = auVar52._0_16_;
              local_250 = auVar57._0_16_;
              local_260 = auVar58._0_16_;
              local_270 = auVar59._0_16_;
              auVar33 = ZEXT1632(auVar33._0_16_);
              (*p_Var9)(&local_2a0);
              auVar33 = vcmpps_avx(auVar33,auVar33,0xf);
              auVar59 = ZEXT1664(local_270);
              auVar58 = ZEXT1664(local_260);
              auVar57 = ZEXT1664(local_250);
              auVar52 = ZEXT1664(local_240);
              auVar50 = ZEXT1664(local_230);
              auVar48 = ZEXT1664(local_220);
              auVar55 = ZEXT1664(local_210);
              auVar54 = ZEXT1664(local_200);
              auVar53 = ZEXT1664(local_1f0);
              auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar45 = ZEXT1664(local_2b0);
            }
            auVar26 = vpcmpeqd_avx(local_2e0,ZEXT816(0) << 0x40);
            auVar21 = vpcmpeqd_avx(local_2d0,ZEXT816(0) << 0x40);
            auVar23._16_16_ = auVar21;
            auVar23._0_16_ = auVar26;
            auVar18._0_4_ = auVar26._0_4_ ^ auVar33._0_4_;
            auVar18._4_4_ = auVar26._4_4_ ^ auVar33._4_4_;
            auVar18._8_4_ = auVar26._8_4_ ^ auVar33._8_4_;
            auVar18._12_4_ = auVar26._12_4_ ^ auVar33._12_4_;
            auVar18._16_4_ = auVar21._0_4_ ^ auVar33._16_4_;
            auVar18._20_4_ = auVar21._4_4_ ^ auVar33._20_4_;
            auVar18._24_4_ = auVar21._8_4_ ^ auVar33._24_4_;
            auVar18._28_4_ = auVar21._12_4_ ^ auVar33._28_4_;
            auVar33 = vblendvps_avx(auVar43._0_32_,*(undefined1 (*) [32])(local_2a0.ray + 0x100),
                                    auVar23);
            *(undefined1 (*) [32])(local_2a0.ray + 0x100) = auVar33;
          }
          auVar21 = auVar52._0_16_;
          auVar26 = auVar48._0_16_;
          auVar33 = auVar50._0_32_;
          auVar37 = auVar55._0_16_;
          auVar31 = auVar54._0_16_;
          auVar28 = auVar58._0_16_;
          auVar46 = auVar53._0_16_;
          auVar20 = auVar59._0_16_;
          auVar16 = auVar57._0_16_;
          auVar41 = ZEXT1664(local_1a0);
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0x7f,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0xbf,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar18[0x1f] < '\0') {
            auVar45 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            bVar15 = true;
            auVar27 = local_1a0;
            goto LAB_00762874;
          }
          *(int *)(ray + k * 4 + 0x100) = auVar45._0_4_;
        }
        auVar21 = auVar52._0_16_;
        auVar26 = auVar48._0_16_;
        auVar33 = auVar50._0_32_;
        auVar37 = auVar55._0_16_;
        auVar31 = auVar54._0_16_;
        auVar28 = auVar58._0_16_;
        auVar46 = auVar53._0_16_;
        auVar20 = auVar59._0_16_;
        auVar16 = auVar57._0_16_;
        uVar14 = uVar14 ^ 1L << (uVar10 & 0x3f);
      } while (uVar14 != 0);
      bVar15 = false;
      auVar27 = auVar41._0_16_;
LAB_00762874:
      auVar38 = vshufps_avx(auVar45._0_16_,auVar45._0_16_,0);
      auVar38 = vcmpps_avx(auVar16,auVar38,2);
      auVar20 = vandps_avx(auVar20,auVar38);
      auVar20 = vandps_avx(auVar20,auVar27);
      uVar13 = vmovmskps_avx(auVar20);
      if (uVar13 == 0) {
        return bVar15;
      }
      fVar2 = auVar28._0_4_;
      auVar17._0_4_ = auVar46._0_4_ * fVar2;
      fVar3 = auVar28._4_4_;
      auVar17._4_4_ = auVar46._4_4_ * fVar3;
      fVar4 = auVar28._8_4_;
      auVar17._8_4_ = auVar46._8_4_ * fVar4;
      fVar25 = auVar28._12_4_;
      auVar17._12_4_ = auVar46._12_4_ * fVar25;
      auVar22._0_4_ = auVar31._0_4_ * fVar2;
      auVar22._4_4_ = auVar31._4_4_ * fVar3;
      auVar22._8_4_ = auVar31._8_4_ * fVar4;
      auVar22._12_4_ = auVar31._12_4_ * fVar25;
      auVar31._0_4_ = auVar37._0_4_ * fVar2;
      auVar31._4_4_ = auVar37._4_4_ * fVar3;
      auVar31._8_4_ = auVar37._8_4_ * fVar4;
      auVar31._12_4_ = auVar37._12_4_ * fVar25;
      local_1d0 = vsubps_avx(auVar17,auVar26);
      local_1c0 = vsubps_avx(auVar22,auVar33._0_16_);
      local_1b0 = vsubps_avx(auVar31,auVar21);
      local_1e0 = auVar16;
      pSVar5 = context->scene;
      uVar14 = (ulong)(uVar13 & 0xff);
      auVar33 = vcmpps_avx(auVar33,auVar33,0xf);
      auVar48 = ZEXT3264(auVar33);
      auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        local_2a0.valid = (int *)local_2e0;
        uVar10 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar13 = *(uint *)(local_190 + uVar10 * 4);
        pGVar6 = (pSVar5->geometries).items[uVar13].ptr;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar11 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00762bd9;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1e0 + uVar10 * 4);
          local_2a0.context = context->user;
          local_e0 = (sphere->primIDs).field_0.i[uVar10];
          local_180 = *(undefined4 *)(local_1d0 + uVar10 * 4);
          local_160 = *(undefined4 *)(local_1c0 + uVar10 * 4);
          local_b0 = vpshufd_avx(ZEXT416(uVar13),0);
          uVar1 = *(undefined4 *)(local_1b0 + uVar10 * 4);
          local_140._4_4_ = uVar1;
          local_140._0_4_ = uVar1;
          local_140._8_4_ = uVar1;
          local_140._12_4_ = uVar1;
          local_140._16_4_ = uVar1;
          local_140._20_4_ = uVar1;
          local_140._24_4_ = uVar1;
          local_140._28_4_ = uVar1;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          uStack_15c = local_160;
          uStack_158 = local_160;
          uStack_154 = local_160;
          uStack_150 = local_160;
          uStack_14c = local_160;
          uStack_148 = local_160;
          uStack_144 = local_160;
          local_100 = ZEXT1632(ZEXT816(0));
          local_120 = ZEXT1632(ZEXT816(0));
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          uStack_9c = (local_2a0.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_2a0.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar12 & 0xf) << 4));
          local_2d0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar12 >> 4) * 0x10);
          local_2a0.geometryUserPtr = pGVar6->userPtr;
          local_2a0.hit = (RTCHitN *)&local_180;
          local_2a0.N = 8;
          local_2a0.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2b0 = auVar45._0_16_;
            auVar33 = ZEXT1632(auVar48._0_16_);
            (*pGVar6->occlusionFilterN)(&local_2a0);
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar33 = vcmpps_avx(auVar33,auVar33,0xf);
            auVar48 = ZEXT3264(auVar33);
            auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar45 = ZEXT1664(local_2b0);
          }
          auVar26 = vpcmpeqd_avx(auVar50._0_16_,local_2e0);
          auVar21 = vpcmpeqd_avx(auVar50._0_16_,local_2d0);
          auVar33._16_16_ = auVar21;
          auVar33._0_16_ = auVar26;
          auVar33 = auVar48._0_32_ & ~auVar33;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0x7f,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar33 >> 0xbf,0) == '\0') &&
              (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar33[0x1f]) {
            auVar19._0_4_ = auVar48._0_4_ ^ auVar26._0_4_;
            auVar19._4_4_ = auVar48._4_4_ ^ auVar26._4_4_;
            auVar19._8_4_ = auVar48._8_4_ ^ auVar26._8_4_;
            auVar19._12_4_ = auVar48._12_4_ ^ auVar26._12_4_;
            auVar19._16_4_ = auVar48._16_4_ ^ auVar21._0_4_;
            auVar19._20_4_ = auVar48._20_4_ ^ auVar21._4_4_;
            auVar19._24_4_ = auVar48._24_4_ ^ auVar21._8_4_;
            auVar19._28_4_ = auVar48._28_4_ ^ auVar21._12_4_;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              local_2b0 = auVar45._0_16_;
              auVar33 = ZEXT1632(auVar48._0_16_);
              (*p_Var9)(&local_2a0);
              auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar33 = vcmpps_avx(auVar33,auVar33,0xf);
              auVar48 = ZEXT3264(auVar33);
              auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar45 = ZEXT1664(local_2b0);
            }
            auVar26 = vpcmpeqd_avx(auVar50._0_16_,local_2e0);
            auVar21 = vpcmpeqd_avx(auVar50._0_16_,local_2d0);
            auVar24._16_16_ = auVar21;
            auVar24._0_16_ = auVar26;
            auVar19._0_4_ = auVar48._0_4_ ^ auVar26._0_4_;
            auVar19._4_4_ = auVar48._4_4_ ^ auVar26._4_4_;
            auVar19._8_4_ = auVar48._8_4_ ^ auVar26._8_4_;
            auVar19._12_4_ = auVar48._12_4_ ^ auVar26._12_4_;
            auVar19._16_4_ = auVar48._16_4_ ^ auVar21._0_4_;
            auVar19._20_4_ = auVar48._20_4_ ^ auVar21._4_4_;
            auVar19._24_4_ = auVar48._24_4_ ^ auVar21._8_4_;
            auVar19._28_4_ = auVar48._28_4_ ^ auVar21._12_4_;
            auVar33 = vblendvps_avx(auVar43._0_32_,*(undefined1 (*) [32])(local_2a0.ray + 0x100),
                                    auVar24);
            *(undefined1 (*) [32])(local_2a0.ray + 0x100) = auVar33;
          }
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0x7f,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0xbf,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar19[0x1f] < '\0') {
            bVar11 = 1;
            goto LAB_00762bd9;
          }
          *(int *)(ray + k * 4 + 0x100) = auVar45._0_4_;
        }
        uVar14 = uVar14 ^ 1L << (uVar10 & 0x3f);
        if (uVar14 == 0) {
          bVar11 = 0;
LAB_00762bd9:
          return (bool)(bVar15 | bVar11);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }